

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_5b5eb::OpenXrProgram::RenderFrame(OpenXrProgram *this)

{
  undefined8 *puVar1;
  float *pfVar2;
  pointer ppXVar3;
  pointer pXVar4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  XrTime XVar9;
  XrResult XVar10;
  mapped_type *pmVar11;
  long lVar12;
  uint32_t i;
  pointer ppXVar13;
  long lVar14;
  ulong uVar15;
  uint32_t viewCountOutput;
  Swapchain viewSwapchain;
  uint32_t swapchainImageIndex;
  XrSpaceLocation spaceLocation;
  vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  projectionLayerViews;
  vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_> layers;
  XrSwapchainImageAcquireInfo acquireInfo;
  vector<Cube,_std::allocator<Cube>_> cubes;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  XrCompositionLayerProjection layer;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  XrViewState viewState;
  XrFrameState frameState;
  XrFrameBeginInfo frameBeginInfo;
  XrFrameWaitInfo frameWaitInfo;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  XrTime local_40;
  XrSpace local_38;
  
  if (this->m_session == (XrSession)0x0) {
    std::__cxx11::string::string((string *)&local_148,"Check failed",(allocator *)&spaceLocation);
    Throw(&local_148,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:866"
         );
  }
  frameWaitInfo.type = XR_TYPE_FRAME_WAIT_INFO;
  frameWaitInfo._4_4_ = 0;
  frameWaitInfo.next = (void *)0x0;
  frameState.next = (void *)0x0;
  frameState.predictedDisplayTime = 0;
  frameState.predictedDisplayPeriod = 0;
  frameState.shouldRender = 0;
  frameState._36_4_ = 0;
  frameState.type = XR_TYPE_FRAME_STATE;
  frameState._4_4_ = 0;
  XVar10 = xrWaitFrame(this->m_session,&frameWaitInfo,&frameState);
  CheckXrResult(XVar10,"xrWaitFrame(m_session, &frameWaitInfo, &frameState)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:870"
               );
  XVar10 = xrBeginFrame(this->m_session);
  CheckXrResult(XVar10,"xrBeginFrame(m_session, &frameBeginInfo)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:873"
               );
  XVar9 = frameState.predictedDisplayTime;
  layers.
  super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layers.
  super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layers.
  super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer.next = (void *)0x0;
  layer.viewCount = 0;
  layer._36_4_ = 0;
  layer.views = (XrCompositionLayerProjectionView *)0x0;
  layer.layerFlags = 0;
  layer.space = (XrSpace)0x0;
  projectionLayerViews.
  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layer.type = XR_TYPE_COMPOSITION_LAYER_PROJECTION;
  layer._4_4_ = 0;
  projectionLayerViews.
  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  projectionLayerViews.
  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (frameState.shouldRender == 1) {
    viewState.viewStateFlags = 0;
    viewState.type = XR_TYPE_VIEW_STATE;
    viewState._4_4_ = 0;
    viewState.next._0_4_ = 0;
    viewState.next._4_4_ = 0;
    uVar15 = (ulong)((long)(this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 6;
    uStack_50 = 0;
    local_58 = 6;
    local_48 = (ulong)(((this->m_options).
                        super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      Parsed).ViewConfigType;
    local_40 = frameState.predictedDisplayTime;
    local_38 = this->m_appSpace;
    XVar10 = xrLocateViews(this->m_session,&local_58,&viewState,uVar15 & 0xffffffff,&viewCountOutput
                          );
    CheckXrResult(XVar10,"xrLocateViews",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:906"
                 );
    if ((~(uint)viewState.viewStateFlags & 3) == 0) {
      if (viewCountOutput != (uint32_t)uVar15) {
        std::__cxx11::string::string((string *)&local_e8,"Check failed",(allocator *)&spaceLocation)
        ;
        Throw(&local_e8,"viewCountOutput == viewCapacityInput",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:912"
             );
      }
      uVar15 = uVar15 & 0xffffffff;
      if (((long)(this->m_configViews).
                 super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_configViews).
                super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28 != uVar15) {
        std::__cxx11::string::string
                  ((string *)&local_108,"Check failed",(allocator *)&spaceLocation);
        Throw(&local_108,"viewCountOutput == m_configViews.size()",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:913"
             );
      }
      if ((long)(this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4 != uVar15) {
        std::__cxx11::string::string
                  ((string *)&local_128,"Check failed",(allocator *)&spaceLocation);
        Throw(&local_128,"viewCountOutput == m_swapchains.size()",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:914"
             );
      }
      std::
      vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>::
      resize(&projectionLayerViews,uVar15);
      cubes.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      cubes.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cubes.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppXVar3 = (this->m_visualizedSpaces).
                super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppXVar13 = (this->m_visualizedSpaces).
                      super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppXVar13 != ppXVar3; ppXVar13 = ppXVar13 + 1
          ) {
        spaceLocation.next = (void *)0x0;
        spaceLocation.pose.position.z = 0.0;
        spaceLocation._52_4_ = 0;
        spaceLocation.pose.orientation.z = 0.0;
        spaceLocation.pose.orientation.w = 0.0;
        spaceLocation.pose.position.x = 0.0;
        spaceLocation.pose.position.y = 0.0;
        spaceLocation.locationFlags = 0;
        spaceLocation.pose.orientation.x = 0.0;
        spaceLocation.pose.orientation.y = 0.0;
        spaceLocation.type = XR_TYPE_SPACE_LOCATION;
        spaceLocation._4_4_ = 0;
        XVar10 = xrLocateSpace(*ppXVar13,this->m_appSpace,XVar9);
        CheckXrResult(XVar10,"xrLocateSpace",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:924"
                     );
        if (XVar10 == XR_SUCCESS) {
          if ((~(uint)spaceLocation.locationFlags & 3) == 0) {
            viewSwapchain.handle = (XrSwapchain)spaceLocation.pose.orientation._0_8_;
            viewSwapchain.width = (int32_t)spaceLocation.pose.orientation.z;
            viewSwapchain.height = (int32_t)spaceLocation.pose.orientation.w;
            std::vector<Cube,_std::allocator<Cube>_>::emplace_back<Cube>
                      (&cubes,(Cube *)&viewSwapchain);
          }
        }
        else {
          Fmt_abi_cxx11_((string *)&viewSwapchain,
                         "Unable to locate a visualized reference space in app space: %d",
                         (ulong)(uint)XVar10);
          Log::Write(Verbose,(string *)&viewSwapchain);
          std::__cxx11::string::~string((string *)&viewSwapchain);
        }
      }
      acquireInfo.type = XR_TYPE_UNKNOWN;
      acquireInfo._4_4_ = 1;
      for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 4) {
        lVar14 = (long)*(int *)((long)&acquireInfo.type + lVar12);
        spaceLocation.next = (void *)0x0;
        spaceLocation.pose.orientation.z = 0.0;
        spaceLocation.pose.orientation.w = 0.0;
        spaceLocation.pose.position.x = 0.0;
        spaceLocation.pose.position.y = 0.0;
        spaceLocation.pose.position.z = 0.0;
        spaceLocation._52_4_ = 0;
        spaceLocation.locationFlags = 0;
        spaceLocation.pose.orientation.x = 0.0;
        spaceLocation.pose.orientation.y = 0.0;
        spaceLocation.type = XR_TYPE_SPACE_LOCATION;
        spaceLocation._4_4_ = 0;
        XVar10 = xrLocateSpace((this->m_input).handSpace._M_elems[lVar14],this->m_appSpace,XVar9);
        CheckXrResult(XVar10,"xrLocateSpace",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:940"
                     );
        if (XVar10 == XR_SUCCESS) {
          if ((~(uint)spaceLocation.locationFlags & 3) == 0) {
            viewSwapchain.handle = (XrSwapchain)spaceLocation.pose.orientation._0_8_;
            viewSwapchain.width = (int32_t)spaceLocation.pose.orientation.z;
            viewSwapchain.height = (int32_t)spaceLocation.pose.orientation.w;
            std::vector<Cube,_std::allocator<Cube>_>::emplace_back<Cube>
                      (&cubes,(Cube *)&viewSwapchain);
          }
        }
        else if ((this->m_input).handActive._M_elems[lVar14] == 1) {
          Fmt_abi_cxx11_((string *)&viewSwapchain,
                         "Unable to locate %s hand action space in app space: %d",
                         &DAT_00116b60 + *(int *)(&DAT_00116b60 + lVar14 * 4));
          Log::Write(Verbose,(string *)&viewSwapchain);
          std::__cxx11::string::~string((string *)&viewSwapchain);
        }
      }
      lVar14 = 0;
      lVar12 = 0;
      for (uVar15 = 0; uVar15 < viewCountOutput; uVar15 = uVar15 + 1) {
        puVar1 = (undefined8 *)
                 ((long)&((this->m_swapchains).
                          super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
                          super__Vector_impl_data._M_start)->handle + lVar14);
        viewSwapchain.handle = (XrSwapchain)*puVar1;
        uVar6 = puVar1[1];
        viewSwapchain.width = (int32_t)uVar6;
        viewSwapchain.height = (int32_t)((ulong)uVar6 >> 0x20);
        acquireInfo.type = XR_TYPE_SWAPCHAIN_IMAGE_ACQUIRE_INFO;
        acquireInfo._4_4_ = 0;
        acquireInfo.next._0_4_ = 0;
        acquireInfo.next._4_4_ = 0;
        XVar10 = xrAcquireSwapchainImage(viewSwapchain.handle,&acquireInfo,&swapchainImageIndex);
        CheckXrResult(XVar10,
                      "xrAcquireSwapchainImage(viewSwapchain.handle, &acquireInfo, &swapchainImageIndex)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:966"
                     );
        spaceLocation.type = XR_TYPE_SWAPCHAIN_IMAGE_WAIT_INFO;
        spaceLocation._4_4_ = 0;
        spaceLocation.next = (void *)0x0;
        spaceLocation.locationFlags = 0x7fffffffffffffff;
        XVar10 = xrWaitSwapchainImage(viewSwapchain.handle,&spaceLocation);
        CheckXrResult(XVar10,"xrWaitSwapchainImage(viewSwapchain.handle, &waitInfo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:970"
                     );
        *(undefined4 *)
         ((long)&(projectionLayerViews.
                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar12) = 0x30;
        *(undefined8 *)
         (&(projectionLayerViews.
            super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
            ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar12) = 0;
        *(undefined8 *)
         ((long)(&(projectionLayerViews.
                   super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar12) + 8) = 0;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.y + lVar12)
        ;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pose).position.y + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->fov).angleUp + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->subImage).swapchain +
                 lVar12 + 4);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.extent.
                         width + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        pXVar4 = (this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2 = &(pXVar4->pose).orientation.x + lVar14;
        uVar6 = *(undefined8 *)pfVar2;
        uVar7 = *(undefined8 *)(pfVar2 + 2);
        pfVar2 = &(pXVar4->pose).orientation.w + lVar14;
        uVar8 = *(undefined8 *)(pfVar2 + 2);
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.w + lVar12)
        ;
        *puVar1 = *(undefined8 *)pfVar2;
        puVar1[1] = uVar8;
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.x + lVar12)
        ;
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        pfVar2 = &(((this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>._M_impl.
                    super__Vector_impl_data._M_start)->fov).angleLeft + lVar14;
        uVar6 = *(undefined8 *)(pfVar2 + 2);
        puVar1 = (undefined8 *)
                 ((long)&((projectionLayerViews.
                           super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                           ._M_impl.super__Vector_impl_data._M_start)->fov).angleLeft + lVar12);
        *puVar1 = *(undefined8 *)pfVar2;
        puVar1[1] = uVar6;
        *(XrSwapchain *)
         ((long)&((projectionLayerViews.
                   super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                   ._M_impl.super__Vector_impl_data._M_start)->subImage).swapchain + lVar12) =
             viewSwapchain.handle;
        *(undefined8 *)
         ((long)&((projectionLayerViews.
                   super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                   ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.offset.x + lVar12
         ) = 0;
        *(ulong *)((long)&((projectionLayerViews.
                            super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                            ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.extent.
                          width + lVar12) = CONCAT44(viewSwapchain.height,viewSwapchain.width);
        pmVar11 = std::
                  map<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>,_std::less<XrSwapchain_T_*>,_std::allocator<std::pair<XrSwapchain_T_*const,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>_>_>
                  ::operator[](&this->m_swapchainImages,&viewSwapchain.handle);
        peVar5 = (this->m_graphicsPlugin).
                 super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar5->_vptr_IGraphicsPlugin[7])
                  (peVar5,(long)&(projectionLayerViews.
                                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar12,
                   (pmVar11->
                   super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[swapchainImageIndex],
                   this->m_colorSwapchainFormat,&cubes);
        local_188 = 0x39;
        uStack_184 = 0;
        uStack_180 = 0;
        uStack_17c = 0;
        XVar10 = xrReleaseSwapchainImage(viewSwapchain.handle,&local_188);
        CheckXrResult(XVar10,"xrReleaseSwapchainImage(viewSwapchain.handle, &releaseInfo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:983"
                     );
        lVar12 = lVar12 + 0x60;
        lVar14 = lVar14 + 0x10;
      }
      layer.space = this->m_appSpace;
      layer.layerFlags = 6;
      if ((((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->Parsed).EnvironmentBlendMode != XR_ENVIRONMENT_BLEND_MODE_ALPHA_BLEND) {
        layer.layerFlags = 0;
      }
      layer.viewCount =
           (uint32_t)
           (((long)projectionLayerViews.
                   super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)projectionLayerViews.
                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x60);
      layer.views = projectionLayerViews.
                    super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::_Vector_base<Cube,_std::allocator<Cube>_>::~_Vector_base
                (&cubes.super__Vector_base<Cube,_std::allocator<Cube>_>);
      spaceLocation._0_8_ = &layer;
      std::vector<XrCompositionLayerBaseHeader*,std::allocator<XrCompositionLayerBaseHeader*>>::
      emplace_back<XrCompositionLayerBaseHeader*>
                ((vector<XrCompositionLayerBaseHeader*,std::allocator<XrCompositionLayerBaseHeader*>>
                  *)&layers,(XrCompositionLayerBaseHeader **)&spaceLocation);
    }
  }
  spaceLocation.next = (void *)0x0;
  spaceLocation.type = XR_TYPE_FRAME_END_INFO;
  spaceLocation._4_4_ = 0;
  spaceLocation.locationFlags = frameState.predictedDisplayTime;
  spaceLocation.pose.orientation.y =
       (float)((ulong)((long)layers.
                             super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)layers.
                            super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
  spaceLocation.pose.orientation.x =
       (float)(((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->Parsed).EnvironmentBlendMode;
  spaceLocation.pose.orientation.z =
       SUB84(layers.
             super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  spaceLocation.pose.orientation.w =
       (float)((ulong)layers.
                      super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  XVar10 = xrEndFrame(this->m_session);
  CheckXrResult(XVar10,"xrEndFrame(m_session, &frameEndInfo)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:889"
               );
  std::
  _Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  ::~_Vector_base(&projectionLayerViews.
                   super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                 );
  std::_Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
  ::~_Vector_base(&layers.
                   super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                 );
  return;
}

Assistant:

void RenderFrame() override {
        CHECK(m_session != XR_NULL_HANDLE);

        XrFrameWaitInfo frameWaitInfo{XR_TYPE_FRAME_WAIT_INFO};
        XrFrameState frameState{XR_TYPE_FRAME_STATE};
        CHECK_XRCMD(xrWaitFrame(m_session, &frameWaitInfo, &frameState));

        XrFrameBeginInfo frameBeginInfo{XR_TYPE_FRAME_BEGIN_INFO};
        CHECK_XRCMD(xrBeginFrame(m_session, &frameBeginInfo));

        std::vector<XrCompositionLayerBaseHeader*> layers;
        XrCompositionLayerProjection layer{XR_TYPE_COMPOSITION_LAYER_PROJECTION};
        std::vector<XrCompositionLayerProjectionView> projectionLayerViews;
        if (frameState.shouldRender == XR_TRUE) {
            if (RenderLayer(frameState.predictedDisplayTime, projectionLayerViews, layer)) {
                layers.push_back(reinterpret_cast<XrCompositionLayerBaseHeader*>(&layer));
            }
        }

        XrFrameEndInfo frameEndInfo{XR_TYPE_FRAME_END_INFO};
        frameEndInfo.displayTime = frameState.predictedDisplayTime;
        frameEndInfo.environmentBlendMode = m_options->Parsed.EnvironmentBlendMode;
        frameEndInfo.layerCount = (uint32_t)layers.size();
        frameEndInfo.layers = layers.data();
        CHECK_XRCMD(xrEndFrame(m_session, &frameEndInfo));
    }